

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_8.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_rowcol_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  byte bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i vH;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  undefined1 auVar15 [32];
  uint uVar16;
  int iVar17;
  parasail_result_t *result;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *palVar18;
  __m256i *palVar19;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *palVar20;
  __m256i *palVar21;
  __m256i *palVar22;
  uint uVar23;
  ulong uVar24;
  char *pcVar25;
  __m256i *ptr;
  uint uVar26;
  ulong uVar27;
  __m256i *palVar28;
  __m256i *ptr_00;
  char *__format;
  __m256i *ptr_01;
  char cVar29;
  int iVar30;
  char cVar31;
  int iVar32;
  long lVar33;
  uint uVar34;
  int iVar35;
  long lVar36;
  char cVar37;
  int32_t t;
  __m256i *ptr_02;
  __m256i *palVar38;
  __m256i *ptr_03;
  ulong uVar39;
  __m256i *ptr_04;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar48 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar49 [16];
  undefined1 auVar55 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [64];
  uint seglen;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 uVar80;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  __m256i *local_278;
  __m256i *local_270;
  __m256i *local_268;
  __m256i *local_260;
  __m256i *local_248;
  __m256i *local_240;
  ulong local_238;
  int local_220;
  ulong local_218;
  undefined1 local_1e8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_158 [32];
  char local_d8;
  undefined1 auVar47 [64];
  undefined1 auVar78 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "profile";
  }
  else {
    pvVar5 = (profile->profile8).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar25 = "profile->profile8.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar25 = "profile->matrix";
      }
      else {
        uVar34 = profile->s1Len;
        local_218 = (ulong)uVar34;
        if ((int)uVar34 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar25 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar25 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar25 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar25 = "open";
        }
        else {
          if (-1 < gap) {
            uVar39 = local_218 + 0x1f >> 5;
            pvVar7 = (profile->profile8).matches;
            pvVar8 = (profile->profile8).similar;
            iVar17 = ppVar6->max;
            uVar23 = (uint)(local_218 + 0x1f) & 0x7fffffe0;
            uVar24 = (ulong)uVar23;
            result = parasail_result_new_rowcol3(uVar23,s2Len);
            if (result != (parasail_result_t *)0x0) {
              uVar23 = (uint)((ulong)(uVar34 - 1) % uVar39);
              result->flag = result->flag | 0x20150804;
              b = parasail_memalign___m256i(0x20,uVar39);
              local_278 = parasail_memalign___m256i(0x20,uVar39);
              b_00 = parasail_memalign___m256i(0x20,uVar39);
              local_268 = parasail_memalign___m256i(0x20,uVar39);
              b_01 = parasail_memalign___m256i(0x20,uVar39);
              palVar18 = parasail_memalign___m256i(0x20,uVar39);
              palVar19 = parasail_memalign___m256i(0x20,uVar39);
              local_270 = parasail_memalign___m256i(0x20,uVar39);
              b_02 = parasail_memalign___m256i(0x20,uVar39);
              b_03 = parasail_memalign___m256i(0x20,uVar39);
              b_04 = parasail_memalign___m256i(0x20,uVar39);
              b_05 = parasail_memalign___m256i(0x20,uVar39);
              palVar20 = parasail_memalign___m256i(0x20,uVar39);
              local_240 = parasail_memalign___m256i(0x20,uVar39);
              local_260 = parasail_memalign___m256i(0x20,uVar39);
              palVar21 = parasail_memalign___m256i(0x20,uVar39);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = b;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = local_278;
              auVar64 = vpunpcklqdq_avx(auVar64,auVar67);
              auVar42._8_8_ = 0;
              auVar42._0_8_ = b_00;
              auVar48._8_8_ = 0;
              auVar48._0_8_ = local_268;
              auVar67 = vpunpcklqdq_avx(auVar42,auVar48);
              auVar42 = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar64;
              auVar48 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = b_01;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = palVar18;
              auVar64 = vpunpcklqdq_avx(auVar49,auVar55);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = palVar19;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = local_270;
              auVar67 = vpunpcklqdq_avx(auVar56,auVar60);
              auVar49 = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar64;
              auVar55 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = b_02;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = b_03;
              auVar64 = vpunpcklqdq_avx(auVar59,auVar61);
              auVar62._8_8_ = 0;
              auVar62._0_8_ = b_04;
              auVar68._8_8_ = 0;
              auVar68._0_8_ = b_05;
              auVar67 = vpunpcklqdq_avx(auVar62,auVar68);
              auVar56 = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar64;
              auVar59 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = palVar20;
              auVar69._8_8_ = 0;
              auVar69._0_8_ = local_240;
              auVar64 = vpunpcklqdq_avx(auVar63,auVar69);
              auVar70._8_8_ = 0;
              auVar70._0_8_ = local_260;
              auVar72._8_8_ = 0;
              auVar72._0_8_ = palVar21;
              auVar67 = vpunpcklqdq_avx(auVar70,auVar72);
              auVar64 = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar64;
              auVar67 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
              auVar43._0_8_ = -(ulong)(auVar42._0_8_ == 0);
              auVar43._8_8_ = -(ulong)(auVar42._8_8_ == 0);
              auVar43._16_8_ = -(ulong)(auVar48._0_8_ == 0);
              auVar43._24_8_ = -(ulong)(auVar48._8_8_ == 0);
              auVar54._0_8_ = -(ulong)(auVar49._0_8_ == 0);
              auVar54._8_8_ = -(ulong)(auVar49._8_8_ == 0);
              auVar54._16_8_ = -(ulong)(auVar55._0_8_ == 0);
              auVar54._24_8_ = -(ulong)(auVar55._8_8_ == 0);
              auVar43 = vpackssdw_avx2(auVar43,auVar54);
              auVar54 = vpermq_avx2(auVar43,0xd8);
              auVar50._0_8_ = -(ulong)(auVar56._0_8_ == 0);
              auVar50._8_8_ = -(ulong)(auVar56._8_8_ == 0);
              auVar50._16_8_ = -(ulong)(auVar59._0_8_ == 0);
              auVar50._24_8_ = -(ulong)(auVar59._8_8_ == 0);
              auVar57._0_8_ = -(ulong)(auVar64._0_8_ == 0);
              auVar57._8_8_ = -(ulong)(auVar64._8_8_ == 0);
              auVar57._16_8_ = -(ulong)(auVar67._0_8_ == 0);
              auVar57._24_8_ = -(ulong)(auVar67._8_8_ == 0);
              auVar43 = vpackssdw_avx2(auVar50,auVar57);
              auVar43 = vpermq_avx2(auVar43,0xd8);
              auVar43 = vpackssdw_avx2(auVar54,auVar43);
              if ((((((((((((((((auVar43 >> 0xf & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                               (auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar43 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar43 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar43 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar43 >> 0x7f,0) == '\0') &&
                        (auVar43 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar43 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar43 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar43 >> 0xbf,0) == '\0') &&
                    (auVar43 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar43 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar43 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar43[0x1f]) {
                local_158._0_8_ = palVar21;
                local_238 = 0;
                uVar40 = (undefined1)open;
                uVar41 = (undefined1)gap;
                alVar1[1]._0_4_ = uVar23;
                alVar1[0] = (longlong)palVar20;
                alVar1[1]._4_4_ = in_stack_fffffffffffffd74;
                alVar1[2]._0_4_ = in_stack_fffffffffffffd78;
                alVar1[2]._4_4_ = in_stack_fffffffffffffd7c;
                alVar1[3] = (longlong)palVar18;
                parasail_memset___m256i(b,alVar1,uVar39);
                alVar2[1]._0_4_ = uVar23;
                alVar2[0] = (longlong)palVar20;
                alVar2[1]._4_4_ = in_stack_fffffffffffffd74;
                alVar2[2]._0_4_ = in_stack_fffffffffffffd78;
                alVar2[2]._4_4_ = in_stack_fffffffffffffd7c;
                alVar2[3] = (longlong)palVar18;
                parasail_memset___m256i(b_00,alVar2,uVar39);
                alVar3[1]._0_4_ = uVar23;
                alVar3[0] = (longlong)palVar20;
                alVar3[1]._4_4_ = in_stack_fffffffffffffd74;
                alVar3[2]._0_4_ = in_stack_fffffffffffffd78;
                alVar3[2]._4_4_ = in_stack_fffffffffffffd7c;
                alVar3[3] = (longlong)palVar18;
                parasail_memset___m256i(b_01,alVar3,uVar39);
                alVar4[1]._0_4_ = uVar23;
                alVar4[0] = (longlong)palVar20;
                alVar4[1]._4_4_ = in_stack_fffffffffffffd74;
                alVar4[2]._0_4_ = in_stack_fffffffffffffd78;
                alVar4[2]._4_4_ = in_stack_fffffffffffffd7c;
                alVar4[3] = (longlong)palVar18;
                parasail_memset___m256i(palVar19,alVar4,uVar39);
                c[1]._0_4_ = uVar23;
                c[0] = (longlong)palVar20;
                c[1]._4_4_ = in_stack_fffffffffffffd74;
                c[2]._0_4_ = in_stack_fffffffffffffd78;
                c[2]._4_4_ = in_stack_fffffffffffffd7c;
                c[3] = (longlong)palVar18;
                parasail_memset___m256i(b_02,c,uVar39);
                c_00[1]._0_4_ = uVar23;
                c_00[0] = (longlong)palVar20;
                c_00[1]._4_4_ = in_stack_fffffffffffffd74;
                c_00[2]._0_4_ = in_stack_fffffffffffffd78;
                c_00[2]._4_4_ = in_stack_fffffffffffffd7c;
                c_00[3] = (longlong)palVar18;
                parasail_memset___m256i(b_03,c_00,uVar39);
                c_01[1]._0_4_ = uVar23;
                c_01[0] = (longlong)palVar20;
                c_01[1]._4_4_ = in_stack_fffffffffffffd74;
                c_01[2]._0_4_ = in_stack_fffffffffffffd78;
                c_01[2]._4_4_ = in_stack_fffffffffffffd7c;
                c_01[3] = (longlong)palVar18;
                parasail_memset___m256i(b_04,c_01,uVar39);
                auVar44._8_8_ = 0x8181818181818181;
                auVar44._0_8_ = 0x8181818181818181;
                auVar44._16_8_ = 0x8181818181818181;
                auVar44._24_8_ = 0x8181818181818181;
                auVar47 = ZEXT3264(auVar44);
                c_02[1]._0_4_ = uVar23;
                c_02[0] = (longlong)palVar20;
                c_02[1]._4_4_ = in_stack_fffffffffffffd74;
                c_02[2]._0_4_ = in_stack_fffffffffffffd78;
                c_02[2]._4_4_ = in_stack_fffffffffffffd7c;
                c_02[3] = (longlong)palVar18;
                parasail_memset___m256i(b_05,c_02,uVar39);
                seglen = (uint)uVar39;
                uVar26 = seglen - 1;
                local_d8 = (char)iVar17;
                uVar24 = CONCAT71((int7)(uVar24 >> 8),'~' - local_d8);
                uVar16 = (uint)CONCAT71((uint7)(uint3)((uint)s2Len >> 8),0x80);
                auVar77[8] = 0x80;
                auVar77._0_8_ = 0x8080808080808080;
                auVar77[9] = 0x80;
                auVar77[10] = 0x80;
                auVar77[0xb] = 0x80;
                auVar77[0xc] = 0x80;
                auVar77[0xd] = 0x80;
                auVar77[0xe] = 0x80;
                auVar77[0xf] = 0x80;
                auVar77[0x10] = 0x80;
                auVar77[0x11] = 0x80;
                auVar77[0x12] = 0x80;
                auVar77[0x13] = 0x80;
                auVar77[0x14] = 0x80;
                auVar77[0x15] = 0x80;
                auVar77[0x16] = 0x80;
                auVar77[0x17] = 0x80;
                auVar77[0x18] = 0x80;
                auVar77[0x19] = 0x80;
                auVar77[0x1a] = 0x80;
                auVar77[0x1b] = 0x80;
                auVar77[0x1c] = 0x80;
                auVar77[0x1d] = 0x80;
                auVar77[0x1e] = 0x80;
                auVar77[0x1f] = 0x80;
                auVar78 = ZEXT3264(auVar77);
                uVar27 = 0;
                auVar79 = ZEXT3264(CONCAT824(0x8080808080808080,
                                             CONCAT816(0x8080808080808080,
                                                       CONCAT88(0x8080808080808080,
                                                                0x8080808080808080))));
                uVar80 = 0;
                auVar43 = auVar77;
                do {
                  palVar22 = palVar19;
                  palVar38 = b_01;
                  palVar21 = b;
                  palVar19 = b_00;
                  local_1b8 = auVar78._0_32_;
                  if (uVar27 == (uint)s2Len) {
                    local_248 = (__m256i *)local_158._0_8_;
                    b = palVar21;
                    b_00 = palVar19;
                    b_01 = palVar38;
                    palVar19 = palVar22;
                    local_220 = s2Len;
LAB_007f8695:
                    palVar38 = local_268;
                    palVar21 = local_270;
                    uVar27 = 0;
                    while (uVar39 != uVar27) {
                      t = (int32_t)uVar27;
                      vH[1]._0_4_ = seglen;
                      vH[0] = (longlong)palVar20;
                      vH[1]._4_4_ = uVar80;
                      vH[2]._0_4_ = in_stack_fffffffffffffd78;
                      vH[2]._4_4_ = uVar16;
                      vH[3] = (longlong)palVar18;
                      arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table +
                                             0x20),vH,t,(int32_t)uVar39,(int32_t)uVar24);
                      vH_00[1]._0_4_ = seglen;
                      vH_00[0] = (longlong)palVar20;
                      vH_00[1]._4_4_ = uVar80;
                      vH_00[2]._0_4_ = in_stack_fffffffffffffd78;
                      vH_00[2]._4_4_ = uVar16;
                      vH_00[3] = (longlong)palVar18;
                      arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table +
                                             0x28),vH_00,t,seglen,(int32_t)uVar24);
                      vH_01[1]._0_4_ = seglen;
                      vH_01[0] = (longlong)palVar20;
                      vH_01[1]._4_4_ = uVar80;
                      vH_01[2]._0_4_ = in_stack_fffffffffffffd78;
                      vH_01[2]._4_4_ = uVar16;
                      vH_01[3] = (longlong)palVar18;
                      arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table +
                                             0x30),vH_01,t,seglen,(int32_t)uVar24);
                      vH_02[1]._0_4_ = seglen;
                      vH_02[0] = (longlong)palVar20;
                      vH_02[1]._4_4_ = uVar80;
                      vH_02[2]._0_4_ = in_stack_fffffffffffffd78;
                      vH_02[2]._4_4_ = uVar16;
                      vH_02[3] = (longlong)palVar18;
                      arr_store_col(*(int **)((long)((result->field_4).trace)->trace_del_table +
                                             0x38),vH_02,t,seglen,(int32_t)uVar24);
                      uVar27 = uVar27 + 1;
                      uVar39 = CONCAT44(uVar80,seglen);
                    }
                    if (((char)uVar16 == '\x7f') ||
                       (auVar46[8] = 0x7f, auVar46._0_8_ = 0x7f7f7f7f7f7f7f7f, auVar46[9] = 0x7f,
                       auVar46[10] = 0x7f, auVar46[0xb] = 0x7f, auVar46[0xc] = 0x7f,
                       auVar46[0xd] = 0x7f, auVar46[0xe] = 0x7f, auVar46[0xf] = 0x7f,
                       auVar46[0x10] = 0x7f, auVar46[0x11] = 0x7f, auVar46[0x12] = 0x7f,
                       auVar46[0x13] = 0x7f, auVar46[0x14] = 0x7f, auVar46[0x15] = 0x7f,
                       auVar46[0x16] = 0x7f, auVar46[0x17] = 0x7f, auVar46[0x18] = 0x7f,
                       auVar46[0x19] = 0x7f, auVar46[0x1a] = 0x7f, auVar46[0x1b] = 0x7f,
                       auVar46[0x1c] = 0x7f, auVar46[0x1d] = 0x7f, auVar46[0x1e] = 0x7f,
                       auVar46[0x1f] = 0x7f, auVar43 = vpcmpeqb_avx2(auVar46,local_1b8),
                       (((((((((((((((((((((((((((((((auVar43 >> 7 & (undefined1  [32])0x1) !=
                                                     (undefined1  [32])0x0 ||
                                                    (auVar43 >> 0xf & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0) ||
                                                   (auVar43 >> 0x17 & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar43 >> 0x1f & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar43 >> 0x27 & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar43 >> 0x2f & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar43 >> 0x37 & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar43 >> 0x3f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar43 >> 0x47 & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar43 >> 0x4f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar43 >> 0x57 & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar43 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar43 >> 0x67 & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar43 >> 0x6f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar43 >> 0x77 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) || SUB321(auVar43 >> 0x7f,0) != '\0')
                                     || (auVar43 >> 0x87 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                    (auVar43 >> 0x8f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar43 >> 0x97 & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar43 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar43 >> 0xa7 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar43 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar43 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || SUB321(auVar43 >> 0xbf,0) != '\0') ||
                             (auVar43 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar43 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar43 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar43 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar43 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar43 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar43 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       auVar43[0x1f] < '\0')) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar17 = parasail_result_is_saturated(result);
                    if (iVar17 == 0) {
                      palVar22 = palVar19;
                      ptr = b_01;
                      palVar28 = b_00;
                      ptr_00 = palVar20;
                      ptr_01 = b;
                      ptr_02 = local_240;
                      ptr_03 = local_260;
                      ptr_04 = local_248;
                      if (((int)local_238 != local_220 + -1) &&
                         (palVar22 = local_248, ptr = local_260, palVar28 = local_240, ptr_00 = b,
                         ptr_01 = palVar20, ptr_02 = b_00, ptr_03 = b_01, ptr_04 = palVar19,
                         (int)local_238 == local_220 + -2)) {
                        local_270 = local_248;
                        local_268 = local_240;
                        palVar22 = palVar21;
                        ptr = palVar18;
                        palVar28 = palVar38;
                        ptr_01 = local_278;
                        palVar18 = local_260;
                        local_278 = palVar20;
                      }
                      cVar29 = -0x80;
                      uVar39 = 0;
                      cVar31 = -0x80;
                      cVar37 = -0x80;
                      while( true ) {
                        if ((seglen & 0x3ffffff) << 5 == (uint)uVar39) break;
                        uVar24 = local_218;
                        if ((*(char *)((long)*ptr_01 + uVar39) == (char)uVar16) &&
                           (uVar34 = ((uint)uVar39 & 0x1f) * seglen +
                                     ((uint)(uVar39 >> 5) & 0x7ffffff), (int)uVar34 < (int)local_218
                           )) {
                          cVar37 = *(char *)((long)*palVar28 + uVar39);
                          cVar31 = *(char *)((long)*ptr + uVar39);
                          cVar29 = *(char *)((long)*palVar22 + uVar39);
                          uVar24 = (ulong)uVar34;
                        }
                        local_218 = uVar24;
                        uVar39 = uVar39 + 1;
                      }
                      iVar35 = (char)uVar16 + 0x80;
                      iVar30 = cVar37 + 0x80;
                      iVar17 = cVar31 + 0x80;
                      iVar32 = cVar29 + 0x80;
                      local_240 = palVar28;
                    }
                    else {
                      local_238._0_4_ = 0;
                      iVar32 = 0x80;
                      iVar17 = 0x80;
                      iVar30 = 0x80;
                      iVar35 = 0x80;
                      local_218._0_4_ = 0;
                      ptr_00 = b;
                      ptr = local_260;
                      palVar22 = local_248;
                      ptr_02 = b_00;
                      ptr_03 = b_01;
                      ptr_04 = palVar19;
                      ptr_01 = palVar20;
                    }
                    result->score = iVar35;
                    result->end_query = (int)local_218;
                    result->end_ref = (int)local_238;
                    ((result->field_4).stats)->matches = iVar30;
                    ((result->field_4).stats)->similar = iVar17;
                    ((result->field_4).stats)->length = iVar32;
                    parasail_free(palVar22);
                    parasail_free(ptr);
                    parasail_free(local_240);
                    parasail_free(ptr_01);
                    parasail_free(b_05);
                    parasail_free(b_04);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(local_270);
                    parasail_free(ptr_04);
                    parasail_free(palVar18);
                    parasail_free(ptr_03);
                    parasail_free(local_268);
                    parasail_free(ptr_02);
                    parasail_free(local_278);
                    parasail_free(ptr_00);
                    return result;
                  }
                  local_198 = auVar79._0_32_;
                  auVar42 = SUB3216(palVar21[uVar26],0);
                  auVar64 = auVar47._0_16_;
                  auVar71._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar64;
                  auVar67 = auVar47._16_16_;
                  auVar71._16_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar42;
                  auVar54 = vpalignr_avx2((undefined1  [32])palVar21[uVar26],auVar71,0xf);
                  auVar42 = SUB3216(palVar19[uVar26],0);
                  auVar73._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar64;
                  auVar73._16_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar42;
                  auVar50 = vpalignr_avx2((undefined1  [32])palVar19[uVar26],auVar73,0xf);
                  auVar42 = SUB3216(palVar38[uVar26],0);
                  auVar74._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar64;
                  auVar74._16_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar42;
                  auVar57 = vpalignr_avx2((undefined1  [32])palVar38[uVar26],auVar74,0xf);
                  auVar42 = SUB3216(palVar22[uVar26],0);
                  auVar75._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar64;
                  auVar75._16_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar42;
                  auVar71 = vpalignr_avx2((undefined1  [32])palVar22[uVar26],auVar75,0xf);
                  auVar64 = vpinsrb_avx(auVar54._0_16_,0x80,0);
                  auVar67 = vpinsrb_avx(auVar50._0_16_,0x80,0);
                  auVar54 = vpblendd_avx2(auVar54,ZEXT1632(auVar64),0xf);
                  auVar50 = vpblendd_avx2(auVar50,ZEXT1632(auVar67),0xf);
                  auVar64 = vpinsrb_avx(auVar57._0_16_,0x80,0);
                  auVar57 = vpblendd_avx2(auVar57,ZEXT1632(auVar64),0xf);
                  auVar64 = vpinsrb_avx(auVar71._0_16_,0x80,0);
                  lVar33 = (long)(int)(ppVar6->mapper[(byte)s2[uVar27]] * seglen) * 0x20;
                  local_220 = (int)uVar27;
                  iVar17 = local_220 + -2;
                  b_00 = local_268;
                  b_01 = palVar18;
                  local_248 = (__m256i *)local_158._0_8_;
                  if ((int)local_238 == iVar17) {
                    b_00 = local_240;
                    b_01 = local_260;
                    local_240 = local_268;
                    local_248 = local_270;
                    local_270 = (__m256i *)local_158._0_8_;
                  }
                  auVar71 = vpblendd_avx2(auVar71,ZEXT1632(auVar64),0xf);
                  b = local_278;
                  if ((int)local_238 == iVar17) {
                    b = palVar20;
                  }
                  auVar13._8_8_ = 0x8080808080808080;
                  auVar13._0_8_ = 0x8080808080808080;
                  auVar13._16_8_ = 0x8080808080808080;
                  auVar13._24_8_ = 0x8080808080808080;
                  auVar73 = auVar13;
                  auVar74 = auVar44;
                  local_1e8 = auVar13;
                  for (lVar36 = 0; auVar75 = auVar73, uVar39 << 5 != lVar36; lVar36 = lVar36 + 0x20)
                  {
                    auVar73 = *(undefined1 (*) [32])((long)*b_02 + lVar36);
                    auVar51 = *(undefined1 (*) [32])((long)*b_03 + lVar36);
                    auVar52 = *(undefined1 (*) [32])((long)*b_04 + lVar36);
                    auVar58 = *(undefined1 (*) [32])((long)*b_05 + lVar36);
                    auVar54 = vpaddsb_avx2(auVar54,*(undefined1 (*) [32])
                                                    ((long)pvVar5 + lVar36 + lVar33));
                    auVar65 = vpmaxsb_avx2(auVar54,auVar73);
                    auVar12 = vpmaxsb_avx2(auVar65,auVar13);
                    *(undefined1 (*) [32])((long)*b + lVar36) = auVar12;
                    auVar10 = vpcmpeqb_avx2(auVar12,auVar77);
                    auVar66 = vpcmpeqb_avx2(auVar12,auVar54);
                    auVar11 = vpcmpgtb_avx2(auVar65,auVar13);
                    auVar65 = vpblendvb_avx2(local_1e8,auVar51,auVar11);
                    auVar54 = vpaddsb_avx2(auVar50,*(undefined1 (*) [32])
                                                    ((long)pvVar7 + lVar36 + lVar33));
                    auVar54 = vpblendvb_avx2(auVar65,auVar54,auVar66);
                    auVar65 = vpblendvb_avx2(auVar54,auVar77,auVar10);
                    *(undefined1 (*) [32])((long)*b_00 + lVar36) = auVar65;
                    auVar50 = vpblendvb_avx2(auVar75,auVar52,auVar11);
                    auVar54 = vpaddsb_avx2(auVar57,*(undefined1 (*) [32])
                                                    ((long)pvVar8 + lVar36 + lVar33));
                    auVar54 = vpblendvb_avx2(auVar50,auVar54,auVar66);
                    auVar57 = vpblendvb_avx2(auVar54,auVar77,auVar10);
                    *(undefined1 (*) [32])((long)*b_01 + lVar36) = auVar57;
                    auVar50 = vpblendvb_avx2(auVar74,auVar58,auVar11);
                    auVar76[8] = 1;
                    auVar76._0_8_ = 0x101010101010101;
                    auVar76[9] = 1;
                    auVar76[10] = 1;
                    auVar76[0xb] = 1;
                    auVar76[0xc] = 1;
                    auVar76[0xd] = 1;
                    auVar76[0xe] = 1;
                    auVar76[0xf] = 1;
                    auVar76[0x10] = 1;
                    auVar76[0x11] = 1;
                    auVar76[0x12] = 1;
                    auVar76[0x13] = 1;
                    auVar76[0x14] = 1;
                    auVar76[0x15] = 1;
                    auVar76[0x16] = 1;
                    auVar76[0x17] = 1;
                    auVar76[0x18] = 1;
                    auVar76[0x19] = 1;
                    auVar76[0x1a] = 1;
                    auVar76[0x1b] = 1;
                    auVar76[0x1c] = 1;
                    auVar76[0x1d] = 1;
                    auVar76[0x1e] = 1;
                    auVar76[0x1f] = 1;
                    auVar54 = vpaddsb_avx2(auVar71,auVar76);
                    auVar54 = vpblendvb_avx2(auVar50,auVar54,auVar66);
                    auVar50 = vpblendvb_avx2(auVar54,auVar77,auVar10);
                    *(undefined1 (*) [32])((long)*local_270 + lVar36) = auVar50;
                    auVar54 = vpmaxsb_avx2(auVar65,local_1b8);
                    auVar66 = vpmaxsb_avx2(auVar57,auVar50);
                    auVar10[1] = uVar40;
                    auVar10[0] = uVar40;
                    auVar10[2] = uVar40;
                    auVar10[3] = uVar40;
                    auVar10[4] = uVar40;
                    auVar10[5] = uVar40;
                    auVar10[6] = uVar40;
                    auVar10[7] = uVar40;
                    auVar10[8] = uVar40;
                    auVar10[9] = uVar40;
                    auVar10[10] = uVar40;
                    auVar10[0xb] = uVar40;
                    auVar10[0xc] = uVar40;
                    auVar10[0xd] = uVar40;
                    auVar10[0xe] = uVar40;
                    auVar10[0xf] = uVar40;
                    auVar10[0x10] = uVar40;
                    auVar10[0x11] = uVar40;
                    auVar10[0x12] = uVar40;
                    auVar10[0x13] = uVar40;
                    auVar10[0x14] = uVar40;
                    auVar10[0x15] = uVar40;
                    auVar10[0x16] = uVar40;
                    auVar10[0x17] = uVar40;
                    auVar10[0x18] = uVar40;
                    auVar10[0x19] = uVar40;
                    auVar10[0x1a] = uVar40;
                    auVar10[0x1b] = uVar40;
                    auVar10[0x1c] = uVar40;
                    auVar10[0x1d] = uVar40;
                    auVar10[0x1e] = uVar40;
                    auVar10[0x1f] = uVar40;
                    auVar11 = vpsubsb_avx2(auVar12,auVar10);
                    auVar15[1] = uVar41;
                    auVar15[0] = uVar41;
                    auVar15[2] = uVar41;
                    auVar15[3] = uVar41;
                    auVar15[4] = uVar41;
                    auVar15[5] = uVar41;
                    auVar15[6] = uVar41;
                    auVar15[7] = uVar41;
                    auVar15[8] = uVar41;
                    auVar15[9] = uVar41;
                    auVar15[10] = uVar41;
                    auVar15[0xb] = uVar41;
                    auVar15[0xc] = uVar41;
                    auVar15[0xd] = uVar41;
                    auVar15[0xe] = uVar41;
                    auVar15[0xf] = uVar41;
                    auVar15[0x10] = uVar41;
                    auVar15[0x11] = uVar41;
                    auVar15[0x12] = uVar41;
                    auVar15[0x13] = uVar41;
                    auVar15[0x14] = uVar41;
                    auVar15[0x15] = uVar41;
                    auVar15[0x16] = uVar41;
                    auVar15[0x17] = uVar41;
                    auVar15[0x18] = uVar41;
                    auVar15[0x19] = uVar41;
                    auVar15[0x1a] = uVar41;
                    auVar15[0x1b] = uVar41;
                    auVar15[0x1c] = uVar41;
                    auVar15[0x1d] = uVar41;
                    auVar15[0x1e] = uVar41;
                    auVar15[0x1f] = uVar41;
                    auVar53 = vpsubsb_avx2(auVar73,auVar15);
                    auVar10 = vpcmpgtb_avx2(auVar11,auVar53);
                    auVar71 = vpblendvb_avx2(auVar51,auVar65,auVar10);
                    local_1b8 = vpmaxsb_avx2(auVar54,auVar66);
                    auVar73 = vpblendvb_avx2(auVar52,auVar57,auVar10);
                    auVar54 = vpaddsb_avx2(auVar58,auVar76);
                    auVar50 = vpaddsb_avx2(auVar76,auVar50);
                    auVar54 = vpblendvb_avx2(auVar54,auVar50,auVar10);
                    auVar51 = vpmaxsb_avx2(auVar11,auVar53);
                    *(undefined1 (*) [32])((long)*b_02 + lVar36) = auVar51;
                    *(undefined1 (*) [32])((long)*b_03 + lVar36) = auVar71;
                    *(undefined1 (*) [32])((long)*b_04 + lVar36) = auVar73;
                    *(undefined1 (*) [32])((long)*b_05 + lVar36) = auVar54;
                    local_198 = vpmaxsb_avx2(auVar12,local_198);
                    auVar54 = vpsubsb_avx2(auVar13,auVar15);
                    auVar13 = vpmaxsb_avx2(auVar11,auVar54);
                    auVar71 = vpcmpgtb_avx2(auVar11,auVar54);
                    local_1e8 = vpblendvb_avx2(local_1e8,auVar65,auVar71);
                    auVar73 = vpblendvb_avx2(auVar75,auVar57,auVar71);
                    auVar54 = vpaddsb_avx2(auVar76,auVar74);
                    auVar74 = vpblendvb_avx2(auVar54,auVar50,auVar71);
                    auVar54 = *(undefined1 (*) [32])((long)*palVar21 + lVar36);
                    auVar50 = *(undefined1 (*) [32])((long)*palVar19 + lVar36);
                    auVar57 = *(undefined1 (*) [32])((long)*palVar38 + lVar36);
                    auVar71 = *(undefined1 (*) [32])((long)*palVar22 + lVar36);
                    local_158 = auVar75;
                  }
                  if ((int)local_238 == iVar17) {
                    palVar20 = local_278;
                    local_260 = palVar18;
                  }
                  for (iVar17 = 0; iVar17 != 0x20; iVar17 = iVar17 + 1) {
                    alVar1 = palVar21[uVar26];
                    auVar64 = alVar1._0_16_;
                    auVar51._0_16_ = ZEXT116(0) * auVar64 + ZEXT116(1) * auVar64;
                    auVar51._16_16_ = ZEXT116(0) * alVar1._16_16_ + ZEXT116(1) * auVar64;
                    auVar54 = vpalignr_avx2((undefined1  [32])alVar1,auVar51,0xf);
                    auVar64 = auVar54._0_16_;
                    auVar52._0_16_ = ZEXT116(0) * auVar13._0_16_ + ZEXT116(1) * auVar64;
                    auVar67 = auVar54._16_16_;
                    auVar52._16_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar13._0_16_;
                    auVar50 = vpalignr_avx2(auVar13,auVar52,0xf);
                    auVar58._0_16_ = ZEXT116(0) * local_1e8._0_16_ + ZEXT116(1) * auVar64;
                    auVar58._16_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * local_1e8._0_16_;
                    auVar57 = vpalignr_avx2(local_1e8,auVar58,0xf);
                    auVar65._0_16_ = ZEXT116(0) * auVar75._0_16_ + ZEXT116(1) * auVar64;
                    auVar65._16_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar75._0_16_;
                    auVar71 = vpalignr_avx2(auVar75,auVar65,0xf);
                    auVar66._0_16_ = ZEXT116(0) * auVar74._0_16_ + ZEXT116(1) * auVar64;
                    auVar66._16_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar74._0_16_;
                    auVar73 = vpalignr_avx2(auVar74,auVar66,0xf);
                    auVar64 = vpinsrb_avx(auVar64,0x80,0);
                    auVar67 = vpinsrb_avx(auVar50._0_16_,0x80,0);
                    auVar54 = vpblendd_avx2(auVar54,ZEXT1632(auVar64),0xf);
                    auVar13 = vpblendd_avx2(auVar50,ZEXT1632(auVar67),0xf);
                    auVar64 = vpinsrb_avx(auVar57._0_16_,0x80,0);
                    local_1e8 = vpblendd_avx2(auVar57,ZEXT1632(auVar64),0xf);
                    auVar64 = vpinsrb_avx(auVar71._0_16_,0x80,0);
                    auVar75 = vpblendd_avx2(auVar71,ZEXT1632(auVar64),0xf);
                    auVar64 = vpinsrb_avx(auVar73._0_16_,0x81,0);
                    auVar74 = vpblendd_avx2(auVar73,ZEXT1632(auVar64),0xf);
                    lVar36 = 0;
                    auVar78 = ZEXT3264(local_1b8);
                    auVar79 = ZEXT3264(local_198);
                    while( true ) {
                      local_1b8 = auVar78._0_32_;
                      local_198 = auVar79._0_32_;
                      if (uVar39 << 5 == lVar36) break;
                      auVar50 = vpaddsb_avx2(auVar54,*(undefined1 (*) [32])
                                                      ((long)pvVar5 + lVar36 + lVar33));
                      auVar54 = *(undefined1 (*) [32])((long)*b + lVar36);
                      auVar73 = vpmaxsb_avx2(auVar54,auVar13);
                      *(undefined1 (*) [32])((long)*b + lVar36) = auVar73;
                      auVar50 = vpcmpeqb_avx2(auVar73,auVar50);
                      auVar54 = vpcmpgtb_avx2(auVar54,auVar13);
                      auVar54 = vpor_avx2(auVar50,auVar54);
                      auVar50 = vpblendvb_avx2(local_1e8,
                                               *(undefined1 (*) [32])((long)*b_00 + lVar36),auVar54)
                      ;
                      *(undefined1 (*) [32])((long)*b_00 + lVar36) = auVar50;
                      auVar57 = vpblendvb_avx2(auVar75,*(undefined1 (*) [32])((long)*b_01 + lVar36),
                                               auVar54);
                      *(undefined1 (*) [32])((long)*b_01 + lVar36) = auVar57;
                      auVar71 = vpblendvb_avx2(auVar74,*(undefined1 (*) [32])
                                                        ((long)*local_270 + lVar36),auVar54);
                      *(undefined1 (*) [32])((long)*local_270 + lVar36) = auVar71;
                      auVar54 = vpmaxsb_avx2(local_1b8,auVar50);
                      auVar51 = vpmaxsb_avx2(auVar57,auVar71);
                      auVar54 = vpmaxsb_avx2(auVar54,auVar51);
                      auVar78 = ZEXT3264(auVar54);
                      auVar54 = vpmaxsb_avx2(auVar73,local_198);
                      auVar79 = ZEXT3264(auVar54);
                      auVar12[1] = uVar40;
                      auVar12[0] = uVar40;
                      auVar12[2] = uVar40;
                      auVar12[3] = uVar40;
                      auVar12[4] = uVar40;
                      auVar12[5] = uVar40;
                      auVar12[6] = uVar40;
                      auVar12[7] = uVar40;
                      auVar12[8] = uVar40;
                      auVar12[9] = uVar40;
                      auVar12[10] = uVar40;
                      auVar12[0xb] = uVar40;
                      auVar12[0xc] = uVar40;
                      auVar12[0xd] = uVar40;
                      auVar12[0xe] = uVar40;
                      auVar12[0xf] = uVar40;
                      auVar12[0x10] = uVar40;
                      auVar12[0x11] = uVar40;
                      auVar12[0x12] = uVar40;
                      auVar12[0x13] = uVar40;
                      auVar12[0x14] = uVar40;
                      auVar12[0x15] = uVar40;
                      auVar12[0x16] = uVar40;
                      auVar12[0x17] = uVar40;
                      auVar12[0x18] = uVar40;
                      auVar12[0x19] = uVar40;
                      auVar12[0x1a] = uVar40;
                      auVar12[0x1b] = uVar40;
                      auVar12[0x1c] = uVar40;
                      auVar12[0x1d] = uVar40;
                      auVar12[0x1e] = uVar40;
                      auVar12[0x1f] = uVar40;
                      auVar52 = vpsubsb_avx2(auVar73,auVar12);
                      auVar11[1] = uVar41;
                      auVar11[0] = uVar41;
                      auVar11[2] = uVar41;
                      auVar11[3] = uVar41;
                      auVar11[4] = uVar41;
                      auVar11[5] = uVar41;
                      auVar11[6] = uVar41;
                      auVar11[7] = uVar41;
                      auVar11[8] = uVar41;
                      auVar11[9] = uVar41;
                      auVar11[10] = uVar41;
                      auVar11[0xb] = uVar41;
                      auVar11[0xc] = uVar41;
                      auVar11[0xd] = uVar41;
                      auVar11[0xe] = uVar41;
                      auVar11[0xf] = uVar41;
                      auVar11[0x10] = uVar41;
                      auVar11[0x11] = uVar41;
                      auVar11[0x12] = uVar41;
                      auVar11[0x13] = uVar41;
                      auVar11[0x14] = uVar41;
                      auVar11[0x15] = uVar41;
                      auVar11[0x16] = uVar41;
                      auVar11[0x17] = uVar41;
                      auVar11[0x18] = uVar41;
                      auVar11[0x19] = uVar41;
                      auVar11[0x1a] = uVar41;
                      auVar11[0x1b] = uVar41;
                      auVar11[0x1c] = uVar41;
                      auVar11[0x1d] = uVar41;
                      auVar11[0x1e] = uVar41;
                      auVar11[0x1f] = uVar41;
                      auVar13 = vpsubsb_avx2(auVar13,auVar11);
                      auVar73 = vpcmpgtb_avx2(auVar13,auVar52);
                      auVar54 = vpcmpeqb_avx2(auVar52,auVar13);
                      auVar51 = vpcmpgtb_avx2(auVar13,auVar77);
                      auVar54 = vpand_avx2(auVar54,auVar51);
                      auVar54 = vpor_avx2(auVar54,auVar73);
                      if ((((((((((((((((((((((((((((((((auVar54 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar54 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar54 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar54 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar54 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar54 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar54 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar54 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar54 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar54 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar54 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar54 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar54 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar54 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar54 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar54 >> 0x7f,0) == '\0') &&
                                        (auVar54 >> 0x87 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar54 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar54 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar54 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar54 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar54 >> 0xaf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar54 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar54 >> 0xbf,0) == '\0') &&
                                (auVar54 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar54 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar54 >> 0xd7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar54 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar54 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar54 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar54 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar54[0x1f]) goto LAB_007f841e;
                      auVar73 = vpcmpgtb_avx2(auVar52,auVar13);
                      local_1e8 = vpblendvb_avx2(local_1e8,auVar50,auVar73);
                      auVar53[8] = 1;
                      auVar53._0_8_ = 0x101010101010101;
                      auVar53[9] = 1;
                      auVar53[10] = 1;
                      auVar53[0xb] = 1;
                      auVar53[0xc] = 1;
                      auVar53[0xd] = 1;
                      auVar53[0xe] = 1;
                      auVar53[0xf] = 1;
                      auVar53[0x10] = 1;
                      auVar53[0x11] = 1;
                      auVar53[0x12] = 1;
                      auVar53[0x13] = 1;
                      auVar53[0x14] = 1;
                      auVar53[0x15] = 1;
                      auVar53[0x16] = 1;
                      auVar53[0x17] = 1;
                      auVar53[0x18] = 1;
                      auVar53[0x19] = 1;
                      auVar53[0x1a] = 1;
                      auVar53[0x1b] = 1;
                      auVar53[0x1c] = 1;
                      auVar53[0x1d] = 1;
                      auVar53[0x1e] = 1;
                      auVar53[0x1f] = 1;
                      auVar75 = vpblendvb_avx2(auVar75,auVar57,auVar73);
                      auVar54 = vpaddsb_avx2(auVar74,auVar53);
                      auVar50 = vpaddsb_avx2(auVar71,auVar53);
                      auVar74 = vpblendvb_avx2(auVar54,auVar50,auVar73);
                      auVar54 = *(undefined1 (*) [32])((long)*palVar21 + lVar36);
                      lVar36 = lVar36 + 0x20;
                    }
                  }
                  auVar78 = ZEXT3264(local_1b8);
                  auVar79 = ZEXT3264(local_198);
LAB_007f841e:
                  alVar1 = b[uVar23];
                  alVar2 = b_00[uVar23];
                  alVar3 = b_01[uVar23];
                  alVar4 = local_270[uVar23];
                  for (iVar17 = 0; iVar17 < 0x1f - (int)((uVar34 - 1) / uVar39); iVar17 = iVar17 + 1
                      ) {
                    auVar54 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28
                                             );
                    alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar54,0xf);
                    auVar54 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28
                                             );
                    alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar54,0xf);
                    auVar54 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28
                                             );
                    alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar54,0xf);
                    auVar54 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,0x28
                                             );
                    alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar54,0xf);
                  }
                  *(int *)(*((result->field_4).trace)->trace_del_table + uVar27 * 4) =
                       alVar1[2]._7_1_ + 0x80;
                  *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 8) +
                          uVar27 * 4) = alVar2[2]._7_1_ + 0x80;
                  *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 0x10) +
                          uVar27 * 4) = alVar3[2]._7_1_ + 0x80;
                  *(int *)(*(long *)((long)((result->field_4).trace)->trace_del_table + 0x18) +
                          uVar27 * 4) = alVar4[2]._7_1_ + 0x80;
                  auVar50 = auVar79._0_32_;
                  auVar54 = vpcmpgtb_avx2(auVar50,auVar43);
                  uVar14 = (uint)(SUB321(auVar54 >> 7,0) & 1) |
                           (uint)(SUB321(auVar54 >> 0xf,0) & 1) << 1 |
                           (uint)(SUB321(auVar54 >> 0x17,0) & 1) << 2 |
                           (uint)(SUB321(auVar54 >> 0x1f,0) & 1) << 3 |
                           (uint)(SUB321(auVar54 >> 0x27,0) & 1) << 4 |
                           (uint)(SUB321(auVar54 >> 0x2f,0) & 1) << 5 |
                           (uint)(SUB321(auVar54 >> 0x37,0) & 1) << 6 |
                           (uint)(SUB321(auVar54 >> 0x3f,0) & 1) << 7 |
                           (uint)(SUB321(auVar54 >> 0x47,0) & 1) << 8 |
                           (uint)(SUB321(auVar54 >> 0x4f,0) & 1) << 9 |
                           (uint)(SUB321(auVar54 >> 0x57,0) & 1) << 10 |
                           (uint)(SUB321(auVar54 >> 0x5f,0) & 1) << 0xb |
                           (uint)(SUB321(auVar54 >> 0x67,0) & 1) << 0xc |
                           (uint)(SUB321(auVar54 >> 0x6f,0) & 1) << 0xd |
                           (uint)(SUB321(auVar54 >> 0x77,0) & 1) << 0xe |
                           (uint)SUB321(auVar54 >> 0x7f,0) << 0xf |
                           (uint)(SUB321(auVar54 >> 0x87,0) & 1) << 0x10 |
                           (uint)(SUB321(auVar54 >> 0x8f,0) & 1) << 0x11 |
                           (uint)(SUB321(auVar54 >> 0x97,0) & 1) << 0x12 |
                           (uint)(SUB321(auVar54 >> 0x9f,0) & 1) << 0x13 |
                           (uint)(SUB321(auVar54 >> 0xa7,0) & 1) << 0x14 |
                           (uint)(SUB321(auVar54 >> 0xaf,0) & 1) << 0x15 |
                           (uint)(SUB321(auVar54 >> 0xb7,0) & 1) << 0x16 |
                           (uint)SUB321(auVar54 >> 0xbf,0) << 0x17 |
                           (uint)(SUB321(auVar54 >> 199,0) & 1) << 0x18 |
                           (uint)(SUB321(auVar54 >> 0xcf,0) & 1) << 0x19 |
                           (uint)(SUB321(auVar54 >> 0xd7,0) & 1) << 0x1a |
                           (uint)(SUB321(auVar54 >> 0xdf,0) & 1) << 0x1b |
                           (uint)(SUB321(auVar54 >> 0xe7,0) & 1) << 0x1c |
                           (uint)(SUB321(auVar54 >> 0xef,0) & 1) << 0x1d |
                           (uint)(SUB321(auVar54 >> 0xf7,0) & 1) << 0x1e |
                           (uint)(byte)(auVar54[0x1f] >> 7) << 0x1f;
                  uVar24 = (ulong)uVar14;
                  palVar18 = palVar38;
                  local_278 = palVar21;
                  local_268 = palVar19;
                  if (uVar14 != 0) {
                    auVar43 = vpermq_avx2(auVar50,0x44);
                    auVar43 = vpmaxsb_avx2(auVar50,auVar43);
                    auVar54 = vpslldq_avx2(auVar43,8);
                    auVar43 = vpmaxsb_avx2(auVar43,auVar54);
                    auVar54 = vpslldq_avx2(auVar43,4);
                    auVar43 = vpmaxsb_avx2(auVar43,auVar54);
                    auVar54 = vpslldq_avx2(auVar43,2);
                    auVar43 = vpmaxsb_avx2(auVar43,auVar54);
                    auVar54 = vpslldq_avx2(auVar43,1);
                    auVar43 = vpmaxsb_avx2(auVar43,auVar54);
                    bVar9 = auVar43[0x17];
                    uVar16 = (uint)bVar9;
                    uVar24 = (ulong)(uint)(int)(char)bVar9;
                    if ((int)(char)('~' - local_d8) < (int)(char)bVar9) {
                      local_1b8 = auVar78._0_32_;
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      palVar19 = local_270;
                      local_270 = palVar22;
                      goto LAB_007f8695;
                    }
                    auVar45[8] = 0xf;
                    auVar45._0_8_ = 0xf0f0f0f0f0f0f0f;
                    auVar45[9] = 0xf;
                    auVar45[10] = 0xf;
                    auVar45[0xb] = 0xf;
                    auVar45[0xc] = 0xf;
                    auVar45[0xd] = 0xf;
                    auVar45[0xe] = 0xf;
                    auVar45[0xf] = 0xf;
                    auVar45[0x10] = 0xf;
                    auVar45[0x11] = 0xf;
                    auVar45[0x12] = 0xf;
                    auVar45[0x13] = 0xf;
                    auVar45[0x14] = 0xf;
                    auVar45[0x15] = 0xf;
                    auVar45[0x16] = 0xf;
                    auVar45[0x17] = 0xf;
                    auVar45[0x18] = 0xf;
                    auVar45[0x19] = 0xf;
                    auVar45[0x1a] = 0xf;
                    auVar45[0x1b] = 0xf;
                    auVar45[0x1c] = 0xf;
                    auVar45[0x1d] = 0xf;
                    auVar45[0x1e] = 0xf;
                    auVar45[0x1f] = 0xf;
                    auVar54 = vpshufb_avx2(auVar43,auVar45);
                    auVar43 = vpermq_avx2(auVar54,0xaa);
                    local_238 = uVar27 & 0xffffffff;
                  }
                  auVar47 = ZEXT3264(auVar54);
                  uVar27 = uVar27 + 1;
                  local_158._0_8_ = local_248;
                  palVar19 = local_270;
                  local_270 = palVar22;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar25 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_stats_rowcol_striped_profile_avx2_256_8",pcVar25);
  return (parasail_result_t *)0x0;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vOne;
    int8_t bias = 0;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m256i vBias;
    __m256i vBias1;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i insert_mask;
    __m256i vSaturationCheckMax;
    __m256i vPosLimit;
    int8_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m256i*)profile->profile8.score;
    vProfileM = (__m256i*)profile->profile8.matches;
    vProfileS = (__m256i*)profile->profile8.similar;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi8(1);
    bias = INT8_MIN;
    score = bias;
    matches = bias;
    similar = bias;
    length = bias;
    vBias = _mm256_set1_epi8(bias);
    vBias1 = _mm256_adds_epi8(vBias,vOne);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    vSaturationCheckMax = vBias;
    vPosLimit = _mm256_set1_epi8(INT8_MAX);
    maxp = INT8_MAX - (int8_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    pvHMax    = parasail_memalign___m256i(32, segLen);
    pvHMMax   = parasail_memalign___m256i(32, segLen);
    pvHSMax   = parasail_memalign___m256i(32, segLen);
    pvHLMax   = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvHMStore, vBias, segLen);
    parasail_memset___m256i(pvHSStore, vBias, segLen);
    parasail_memset___m256i(pvHLStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);
    parasail_memset___m256i(pvEM, vBias, segLen);
    parasail_memset___m256i(pvES, vBias, segLen);
    parasail_memset___m256i(pvEL, vBias1, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vBias;
        vFM = vBias;
        vFS = vBias;
        vFL = vBias1;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 1);
        vHM = _mm256_slli_si256_rpl(vHM, 1);
        vHS = _mm256_slli_si256_rpl(vHS, 1);
        vHL = _mm256_slli_si256_rpl(vHL, 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);
        vHM = _mm256_blendv_epi8(vHM, vBias, insert_mask);
        vHS = _mm256_blendv_epi8(vHS, vBias, insert_mask);
        vHL = _mm256_blendv_epi8(vHL, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i cond_zero;
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            /*vH = _mm256_max_epi8(vH_dag, vBias);*/
            vH = _mm256_max_epi8(vH_dag, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            cond_zero = _mm256_cmpeq_epi8(vH, vBias);

            case1 = _mm256_cmpeq_epi8(vH, vH_dag);
            case2 = _mm256_cmpeq_epi8(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_adds_epi8(vHM, _mm256_load_si256(vPM + i)), case1);
            vHM = _mm256_blendv_epi8(vHM, vBias, cond_zero);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_adds_epi8(vHS, _mm256_load_si256(vPS + i)), case1);
            vHS = _mm256_blendv_epi8(vHS, vBias, cond_zero);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_adds_epi8(vHL, vOne), case1);
            vHL = _mm256_blendv_epi8(vHL, vBias, cond_zero);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len, bias);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);
            vEF_opn = _mm256_subs_epi8(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi8(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vEL, vOne),
                    _mm256_adds_epi8(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi8(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vFL, vOne),
                    _mm256_adds_epi8(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 1);
            vF = _mm256_slli_si256_rpl(vF, 1);
            vFM = _mm256_slli_si256_rpl(vFM, 1);
            vFS = _mm256_slli_si256_rpl(vFS, 1);
            vFL = _mm256_slli_si256_rpl(vFL, 1);
            vHp = _mm256_blendv_epi8(vHp, vBias, insert_mask);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            vFM = _mm256_blendv_epi8(vFM, vBias, insert_mask);
            vFS = _mm256_blendv_epi8(vFS, vBias, insert_mask);
            vFL = _mm256_blendv_epi8(vFL, vBias1, insert_mask);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_adds_epi8(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH, vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi8(vH, vHp);
                case2 = _mm256_cmpeq_epi8(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len, bias);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm256_subs_epi8(vH, vGapO);
                vF_ext = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi8(vF_ext, vEF_opn),
                                _mm256_and_si256(
                                    _mm256_cmpeq_epi8(vF_ext, vEF_opn),
                                    _mm256_cmpgt_epi8(vF_ext, vBias)))))
                    goto end;
                /*vF = _mm256_max_epi8(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi8(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_adds_epi8(vFL, vOne),
                        _mm256_adds_epi8(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
                vHM = _mm256_slli_si256_rpl(vHM, 1);
                vHS = _mm256_slli_si256_rpl(vHS, 1);
                vHL = _mm256_slli_si256_rpl(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
            result->stats->rowcols->matches_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHM, 31) - bias;
            result->stats->rowcols->similar_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHS, 31) - bias;
            result->stats->rowcols->length_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHL, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen, bias);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen, bias);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen, bias);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX
            || _mm256_movemask_epi8(_mm256_cmpeq_epi8(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int8_t *m = (int8_t*)pvHMMax;
            int8_t *s = (int8_t*)pvHSMax;
            int8_t *l = (int8_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches - bias;
    result->stats->similar = similar - bias;
    result->stats->length = length - bias;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}